

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O1

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::splitUpTo
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  uint uVar1;
  char *__s;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  char in_CL;
  undefined7 in_register_00000011;
  ulong uVar5;
  ulong extraout_RDX;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  VerySimpleReadOnlyString VVar10;
  
  uVar1 = find->length;
  __s = find->data;
  uVar9 = *(uint *)((long *)CONCAT71(in_register_00000011,includeFind) + 1);
  uVar5 = 0;
  uVar2 = 0;
  do {
    uVar7 = uVar2;
    if (uVar2 < uVar1) {
      uVar7 = uVar1;
    }
    uVar8 = 0;
    while( true ) {
      uVar3 = uVar1;
      if (uVar7 + (int)uVar5 == uVar8) goto LAB_00113975;
      if (*(char *)(*(long *)CONCAT71(in_register_00000011,includeFind) + (ulong)uVar8) !=
          __s[uVar2 + uVar8]) break;
      uVar8 = uVar8 + 1;
      uVar3 = uVar2;
      if (uVar9 == uVar8) {
LAB_00113975:
        if (uVar3 == uVar1) {
          this->data = __s;
          this->length = uVar1;
          iVar6 = 0;
          uVar9 = uVar1;
        }
        else {
          uVar9 = uVar9 + uVar3;
          if (in_CL != '\0') {
            uVar3 = uVar9;
          }
          this->data = __s;
          if (uVar3 == 0xffffffff) {
            if (__s == (char *)0x0) {
              uVar3 = 0;
            }
            else {
              sVar4 = strlen(__s);
              uVar3 = (uint)sVar4;
              uVar5 = extraout_RDX;
            }
          }
          this->length = uVar3;
          iVar6 = uVar1 - uVar9;
        }
        find->data = __s + (int)uVar9;
        find->length = iVar6;
        VVar10._8_8_ = uVar5;
        VVar10.data = (tCharPtr)this;
        return VVar10;
      }
    }
    uVar2 = uVar2 + 1;
    uVar5 = (ulong)((int)uVar5 - 1);
  } while( true );
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::splitUpTo(const VerySimpleReadOnlyString & find, const bool includeFind)
    {
	    const unsigned int pos = Find(find);
	    if (pos == (unsigned int)length)
	    {
            VerySimpleReadOnlyString ret(*this);
            (void)Mutate(data + length, 0);
            return ret;
	    }
	    const int size = pos + find.length;
	    VerySimpleReadOnlyString ret(data, includeFind ? size : pos);
        (void)Mutate(data+size, length - size);
	    return ret;
    }